

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_zlib_decode_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  undefined1 local_1018 [8];
  stbi__zbuf a;
  
  a.zbuffer = (stbi_uc *)(ibuffer + ilen);
  local_1018 = (undefined1  [8])ibuffer;
  iVar1 = stbi__do_zlib((stbi__zbuf *)local_1018,obuffer,olen,0,1);
  return -(uint)(iVar1 == 0) | a.num_bits - (int)a.zout;
}

Assistant:

STBIDEF int stbi_zlib_decode_buffer(char *obuffer, int olen, char const *ibuffer, int ilen)
{
   stbi__zbuf a;
   a.zbuffer = (stbi_uc *) ibuffer;
   a.zbuffer_end = (stbi_uc *) ibuffer + ilen;
   if (stbi__do_zlib(&a, obuffer, olen, 0, 1))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}